

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_option.c
# Opt level: O0

void nghttp2_option_set_builtin_recv_extension_type(nghttp2_option *option,uint8_t type)

{
  uint8_t type_local;
  nghttp2_option *option_local;
  
  if (type == '\n') {
    option->opt_set_mask = option->opt_set_mask | 0x80;
    option->builtin_recv_ext_types = option->builtin_recv_ext_types | 1;
  }
  else if (type == '\f') {
    option->opt_set_mask = option->opt_set_mask | 0x80;
    option->builtin_recv_ext_types = option->builtin_recv_ext_types | 2;
  }
  else if (type == '\x10') {
    option->opt_set_mask = option->opt_set_mask | 0x80;
    option->builtin_recv_ext_types = option->builtin_recv_ext_types | 4;
  }
  return;
}

Assistant:

void nghttp2_option_set_builtin_recv_extension_type(nghttp2_option *option,
                                                    uint8_t type) {
  switch (type) {
  case NGHTTP2_ALTSVC:
    option->opt_set_mask |= NGHTTP2_OPT_BUILTIN_RECV_EXT_TYPES;
    option->builtin_recv_ext_types |= NGHTTP2_TYPEMASK_ALTSVC;
    return;
  case NGHTTP2_ORIGIN:
    option->opt_set_mask |= NGHTTP2_OPT_BUILTIN_RECV_EXT_TYPES;
    option->builtin_recv_ext_types |= NGHTTP2_TYPEMASK_ORIGIN;
    return;
  case NGHTTP2_PRIORITY_UPDATE:
    option->opt_set_mask |= NGHTTP2_OPT_BUILTIN_RECV_EXT_TYPES;
    option->builtin_recv_ext_types |= NGHTTP2_TYPEMASK_PRIORITY_UPDATE;
    return;
  default:
    return;
  }
}